

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  uint uVar1;
  ZSTD_TraceCtx ZVar2;
  ZSTD_CCtx *local_78;
  size_t local_68;
  size_t err_code_1;
  size_t dictID;
  size_t err_code;
  size_t dictContentSize;
  ZSTD_CDict *cdict_local;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  ZSTD_dictContentType_e dictContentType_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  local_68 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    local_68 = cdict->dictContentSize;
  }
  ZVar2 = ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar2;
  if ((((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((cdict->dictContentSize * 6 <= pledgedSrcSize && (pledgedSrcSize != 0xffffffffffffffff)) &&
        (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_resetCCtx_internal
                           (cctx,params,pledgedSrcSize,local_68,ZSTDcrp_makeClean,zbuff);
    uVar1 = ERR_isError((size_t)cctx_local);
    if (uVar1 == 0) {
      if (cdict == (ZSTD_CDict *)0x0) {
        local_78 = (ZSTD_CCtx *)
                   ZSTD_compress_insertDictionary
                             ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,
                              &cctx->ldmState,&cctx->workspace,&cctx->appliedParams,dict,dictSize,
                              dictContentType,dtlm,cctx->entropyWorkspace);
      }
      else {
        local_78 = (ZSTD_CCtx *)
                   ZSTD_compress_insertDictionary
                             ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,
                              &cctx->ldmState,&cctx->workspace,&cctx->appliedParams,
                              cdict->dictContent,cdict->dictContentSize,cdict->dictContentType,dtlm,
                              cctx->entropyWorkspace);
      }
      uVar1 = ERR_isError((size_t)local_78);
      if (uVar1 == 0) {
        cctx->dictID = (U32)local_78;
        cctx->dictContentSize = local_68;
        cctx_local = (ZSTD_CCtx *)0x0;
      }
      else {
        cctx_local = local_78;
      }
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)ZSTD_resetCCtx_usingCDict(cctx,cdict,params,pledgedSrcSize,zbuff);
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}